

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamUtils.cpp
# Opt level: O2

ostream * operator<<(ostream *lhs,EntityType *rhs)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(lhs,"EntityType (");
  DIS::EntityType::getEntityKind(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  DIS::EntityType::getDomain(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  DIS::EntityType::getCountry(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  DIS::EntityType::getCategory(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  DIS::EntityType::getSubcategory(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,") ");
  return lhs;
}

Assistant:

std::ostream& operator <<(std::ostream& lhs, const DIS::EntityType& rhs)
{
   lhs << "EntityType ("
       << (unsigned int)rhs.getEntityKind()
       << "," << (unsigned int)rhs.getDomain()
       << "," << (unsigned int)rhs.getCountry()
       << "," << (unsigned int)rhs.getCategory()
       << "," << (unsigned int)rhs.getSubcategory()
       << ") ";
   return lhs;
}